

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O3

SQFunctionProto *
SQFunctionProto::Create
          (SQSharedState *ss,SQUnsignedInteger lang_features,SQInteger ninstructions,
          SQInteger nliterals,SQInteger nparameters,SQInteger nfunctions,SQInteger noutervalues,
          SQInteger nlineinfos,SQInteger nlocalvarinfos,SQInteger ndefaultparams)

{
  undefined8 *puVar1;
  SQObjectPtr *pSVar2;
  SQLocalVarInfo *pSVar3;
  SQFunctionProto *this;
  SQInstruction *pSVar4;
  long lVar5;
  long lVar6;
  SQOuterVar *pSVar7;
  
  this = (SQFunctionProto *)
         sq_vm_malloc(ss->_alloc_ctx,
                      (nparameters + nliterals + nfunctions) * 0x10 + nlocalvarinfos * 0x20 +
                      noutervalues * 0x30 + (nlineinfos + ninstructions + ndefaultparams) * 8 + 0xf8
                     );
  SQFunctionProto(this,ss);
  this->_alloc_ctx = ss->_alloc_ctx;
  this->lang_features = lang_features;
  this->_ninstructions = ninstructions;
  this->_literals = (SQObjectPtr *)(this->_instructions + ninstructions);
  this->_nliterals = nliterals;
  pSVar4 = this->_instructions + ninstructions + nliterals * 2;
  this->_parameters = (SQObjectPtr *)pSVar4;
  this->_nparameters = nparameters;
  pSVar4 = pSVar4 + nparameters * 2;
  this->_functions = (SQObjectPtr *)pSVar4;
  this->_nfunctions = nfunctions;
  pSVar7 = (SQOuterVar *)(pSVar4 + nfunctions * 2);
  this->_outervalues = pSVar7;
  this->_noutervalues = noutervalues;
  this->_lineinfos = (SQLineInfo *)(pSVar7 + noutervalues);
  this->_nlineinfos = nlineinfos;
  pSVar3 = (SQLocalVarInfo *)
           ((anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&pSVar7[noutervalues]._type +
           nlineinfos * 2);
  this->_localvarinfos = pSVar3;
  this->_nlocalvarinfos = nlocalvarinfos;
  this->_defaultparams = (SQInteger *)(pSVar3 + nlocalvarinfos);
  this->_ndefaultparams = ndefaultparams;
  if (0 < nliterals) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pSVar2 = this->_literals;
      puVar1 = (undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&(pSVar2->super_SQObject)._type + lVar5) = 0x1000001;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->_nliterals);
    nparameters = this->_nparameters;
  }
  if (0 < nparameters) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pSVar2 = this->_parameters;
      puVar1 = (undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&(pSVar2->super_SQObject)._type + lVar5) = 0x1000001;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->_nparameters);
  }
  if (0 < this->_nfunctions) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pSVar2 = this->_functions;
      puVar1 = (undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&(pSVar2->super_SQObject)._type + lVar5) = 0x1000001;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->_nfunctions);
  }
  if (0 < this->_noutervalues) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pSVar7 = this->_outervalues;
      puVar1 = (undefined8 *)((long)&pSVar7->_type + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&pSVar7->_type + lVar5) = 0x1000001;
      puVar1 = (undefined8 *)((long)&(pSVar7->_name).super_SQObject._unVal + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&(pSVar7->_name).super_SQObject._unVal + lVar5) = 0x1000001;
      *(undefined1 *)((long)&(pSVar7->_src).super_SQObject._unVal + lVar5) = 1;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x30;
    } while (lVar6 < this->_noutervalues);
  }
  if (0 < this->_nlocalvarinfos) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pSVar3 = this->_localvarinfos;
      puVar1 = (undefined8 *)((long)&(pSVar3->_name).super_SQObject._type + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&(pSVar3->_name).super_SQObject._type + lVar5) = 0x1000001;
      *(undefined8 *)((long)&pSVar3->_start_op + lVar5) = 0;
      *(undefined4 *)((long)&pSVar3->_pos + lVar5) = 0;
      (&pSVar3->_assignable)[lVar5] = true;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar6 < this->_nlocalvarinfos);
  }
  return this;
}

Assistant:

static SQFunctionProto *Create(SQSharedState *ss,
        SQUnsignedInteger lang_features,
        SQInteger ninstructions,
        SQInteger nliterals,SQInteger nparameters,
        SQInteger nfunctions,SQInteger noutervalues,
        SQInteger nlineinfos,SQInteger nlocalvarinfos,SQInteger ndefaultparams)
    {
        SQFunctionProto *f;
        //I compact the whole class and members in a single memory allocation
        f = (SQFunctionProto *)sq_vm_malloc(ss->_alloc_ctx,
            _FUNC_SIZE(ninstructions,nliterals,nparameters,nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams));

        new (f) SQFunctionProto(ss);
        f->_alloc_ctx = ss->_alloc_ctx;
        f->lang_features = lang_features;
        f->_ninstructions = ninstructions;
        f->_literals = (SQObjectPtr*)&f->_instructions[ninstructions];
        f->_nliterals = nliterals;
        f->_parameters = (SQObjectPtr*)&f->_literals[nliterals];
        f->_nparameters = nparameters;
        f->_functions = (SQObjectPtr*)&f->_parameters[nparameters];
        f->_nfunctions = nfunctions;
        f->_outervalues = (SQOuterVar*)&f->_functions[nfunctions];
        f->_noutervalues = noutervalues;
        f->_lineinfos = (SQLineInfo *)&f->_outervalues[noutervalues];
        f->_nlineinfos = nlineinfos;
        f->_localvarinfos = (SQLocalVarInfo *)&f->_lineinfos[nlineinfos];
        f->_nlocalvarinfos = nlocalvarinfos;
        f->_defaultparams = (SQInteger *)&f->_localvarinfos[nlocalvarinfos];
        f->_ndefaultparams = ndefaultparams;

        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nliterals,f->_literals);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nparameters,f->_parameters);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nfunctions,f->_functions);
        _CONSTRUCT_VECTOR(SQOuterVar,f->_noutervalues,f->_outervalues);
        //_CONSTRUCT_VECTOR(SQLineInfo,f->_nlineinfos,f->_lineinfos); //not required are 2 integers
        _CONSTRUCT_VECTOR(SQLocalVarInfo,f->_nlocalvarinfos,f->_localvarinfos);
        return f;
    }